

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

void __thiscall
GraphContigger::clip_all_tips
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  bool bVar1;
  uint64_t uVar2;
  ostream *poVar3;
  NodeView *nv;
  pointer this_00;
  NodeView *this_01;
  int iVar4;
  int iVar5;
  vector<NodeView,_std::allocator<NodeView>_> local_48;
  
  iVar4 = 0;
  DistanceGraph::get_all_nodeviews(&local_48,*(DistanceGraph **)this,false,true);
  iVar5 = 0;
  if (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    iVar4 = 0;
    this_00 = local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar2 = NodeView::size(this_00);
      if (uVar2 <= (ulong)(long)size) {
        this_01 = this_00;
        bVar1 = NodeView::is_tip(this_00);
        if (bVar1) {
          bVar1 = clip_tip((GraphContigger *)this_01,ge,this_00,peds,5,10,10,false);
          iVar5 = iVar5 + 1;
          iVar4 = iVar4 + (uint)bVar1;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeView *)0x0) {
    operator_delete(local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tips solved!",0xd);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (apply) {
    GraphEditor::apply_all(ge);
    SequenceDistanceGraph::join_all_unitigs(*(SequenceDistanceGraph **)this);
  }
  return;
}

Assistant:

void GraphContigger::clip_all_tips(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply) {
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_tip()){
            total++;
            if (clip_tip(ge, nv, peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " tips solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}